

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O0

void __thiscall
CCompExp::CCompExp(CCompExp *this,IExpression *leftOperand,IExpression *rightOperand,
                  TCompareOperation operation)

{
  unique_ptr<IExpression,_std::default_delete<IExpression>_> local_58;
  unique_ptr<IExpression,_std::default_delete<IExpression>_> local_50 [3];
  PositionInfo local_34;
  TCompareOperation local_24;
  IExpression *pIStack_20;
  TCompareOperation operation_local;
  IExpression *rightOperand_local;
  IExpression *leftOperand_local;
  CCompExp *this_local;
  
  local_24 = operation;
  pIStack_20 = rightOperand;
  rightOperand_local = leftOperand;
  leftOperand_local = &this->super_IExpression;
  IExpression::IExpression((IExpression *)this);
  (this->super_IExpression).super_PositionedNode.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_00236ee8;
  std::unique_ptr<IExpression,std::default_delete<IExpression>>::
  unique_ptr<std::default_delete<IExpression>,void>
            ((unique_ptr<IExpression,std::default_delete<IExpression>> *)&this->leftOperand);
  std::unique_ptr<IExpression,std::default_delete<IExpression>>::
  unique_ptr<std::default_delete<IExpression>,void>
            ((unique_ptr<IExpression,std::default_delete<IExpression>> *)&this->rightOperand);
  local_34 = PositionInfo::operator+
                       (&(rightOperand_local->super_PositionedNode).position,
                        &(pIStack_20->super_PositionedNode).position);
  (this->super_IExpression).super_PositionedNode.position = local_34;
  std::unique_ptr<IExpression,std::default_delete<IExpression>>::
  unique_ptr<std::default_delete<IExpression>,void>
            ((unique_ptr<IExpression,std::default_delete<IExpression>> *)local_50,rightOperand_local
            );
  std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator=
            (&this->leftOperand,local_50);
  std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::~unique_ptr(local_50);
  std::unique_ptr<IExpression,std::default_delete<IExpression>>::
  unique_ptr<std::default_delete<IExpression>,void>
            ((unique_ptr<IExpression,std::default_delete<IExpression>> *)&local_58,pIStack_20);
  std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator=
            (&this->rightOperand,&local_58);
  std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::~unique_ptr(&local_58);
  this->operation = local_24;
  return;
}

Assistant:

CCompExp::CCompExp(
        IExpression *leftOperand,
        IExpression *rightOperand,
        enums::TCompareOperation operation
) {
    this->position = leftOperand->position + rightOperand->position;
    this->leftOperand = std::unique_ptr<IExpression>( leftOperand );
    this->rightOperand = std::unique_ptr<IExpression>( rightOperand );
    this->operation = operation;
}